

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

bool __thiscall
crunch::process_input_spec(crunch *this,file_desc_vec *files,dynamic_string *input_spec)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  file_desc_vec *pfVar5;
  undefined1 local_d8 [7];
  bool success;
  find_files file_finder;
  undefined1 local_b0 [8];
  dynamic_string find_filename;
  dynamic_string find_pathname;
  dynamic_string find_ext;
  dynamic_string find_fname;
  dynamic_string find_path;
  dynamic_string find_drive;
  bool deep_flag;
  undefined1 local_38 [8];
  dynamic_string find_name;
  dynamic_string *input_spec_local;
  file_desc_vec *files_local;
  crunch *this_local;
  
  find_name.m_pStr = (char *)input_spec;
  crnlib::dynamic_string::dynamic_string((dynamic_string *)local_38,input_spec);
  uVar2 = crnlib::dynamic_string::get_len((dynamic_string *)local_38);
  if (uVar2 != 0) {
    pcVar3 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_38);
    bVar1 = crnlib::file_utils::does_dir_exist(pcVar3);
    if (bVar1) {
      pcVar3 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_38);
      crnlib::file_utils::combine_path((dynamic_string *)local_38,pcVar3,"*");
    }
  }
  bVar1 = crnlib::dynamic_string::is_empty((dynamic_string *)local_38);
  if ((bVar1) || (bVar1 = crnlib::file_utils::full_path((dynamic_string *)local_38), !bVar1)) {
    pcVar3 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_38);
    crnlib::console::error("Invalid input filename: %s",pcVar3);
    this_local._7_1_ = false;
  }
  else {
    bVar1 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"deep",0,false);
    crnlib::dynamic_string::dynamic_string((dynamic_string *)&find_path.m_pStr);
    crnlib::dynamic_string::dynamic_string((dynamic_string *)&find_fname.m_pStr);
    crnlib::dynamic_string::dynamic_string((dynamic_string *)&find_ext.m_pStr);
    crnlib::dynamic_string::dynamic_string((dynamic_string *)&find_pathname.m_pStr);
    pcVar3 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_38);
    crnlib::file_utils::split_path
              (pcVar3,(dynamic_string *)&find_path.m_pStr,(dynamic_string *)&find_fname.m_pStr,
               (dynamic_string *)&find_ext.m_pStr,(dynamic_string *)&find_pathname.m_pStr);
    crnlib::dynamic_string::dynamic_string((dynamic_string *)&find_filename.m_pStr);
    pcVar3 = crnlib::dynamic_string::get_ptr((dynamic_string *)&find_path.m_pStr);
    pcVar4 = crnlib::dynamic_string::get_ptr((dynamic_string *)&find_fname.m_pStr);
    crnlib::file_utils::combine_path((dynamic_string *)&find_filename.m_pStr,pcVar3,pcVar4);
    crnlib::dynamic_string::dynamic_string((dynamic_string *)local_b0);
    crnlib::operator+((crnlib *)&file_finder.m_last_error,(dynamic_string *)&find_ext.m_pStr,
                      (dynamic_string *)&find_pathname.m_pStr);
    crnlib::dynamic_string::operator=
              ((dynamic_string *)local_b0,(dynamic_string *)&file_finder.m_last_error);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)&file_finder.m_last_error);
    crnlib::find_files::find_files((find_files *)local_d8);
    pcVar3 = crnlib::dynamic_string::get_ptr((dynamic_string *)&find_filename.m_pStr);
    pcVar4 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_b0);
    bVar1 = crnlib::find_files::find((find_files *)local_d8,pcVar3,pcVar4,bVar1 | 4);
    if (bVar1) {
      pfVar5 = crnlib::find_files::get_files((find_files *)local_d8);
      bVar1 = crnlib::vector<crnlib::find_files::file_desc>::empty(pfVar5);
      if (bVar1) {
        pcVar3 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_38);
        crnlib::console::warning("No files found: %s",pcVar3);
        this_local._7_1_ = true;
      }
      else {
        pfVar5 = crnlib::find_files::get_files((find_files *)local_d8);
        crnlib::vector<crnlib::find_files::file_desc>::append(files,pfVar5);
        this_local._7_1_ = true;
      }
    }
    else {
      pcVar3 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_38);
      crnlib::console::error("Failed finding files: %s",pcVar3);
      this_local._7_1_ = false;
    }
    crnlib::find_files::~find_files((find_files *)local_d8);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)local_b0);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)&find_filename.m_pStr);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)&find_pathname.m_pStr);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)&find_ext.m_pStr);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)&find_fname.m_pStr);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)&find_path.m_pStr);
  }
  crnlib::dynamic_string::~dynamic_string((dynamic_string *)local_38);
  return this_local._7_1_;
}

Assistant:

bool process_input_spec(find_files::file_desc_vec& files, const dynamic_string& input_spec)
    {
        dynamic_string find_name(input_spec);

        if ((find_name.get_len()) && (file_utils::does_dir_exist(find_name.get_ptr())))
        {
            file_utils::combine_path(find_name, find_name.get_ptr(), "*");
        }

        if ((find_name.is_empty()) || (!file_utils::full_path(find_name)))
        {
            console::error("Invalid input filename: %s", find_name.get_ptr());
            return false;
        }

        const bool deep_flag = m_params.get_value_as_bool("deep");

        dynamic_string find_drive, find_path, find_fname, find_ext;
        file_utils::split_path(find_name.get_ptr(), &find_drive, &find_path, &find_fname, &find_ext);

        dynamic_string find_pathname;
        file_utils::combine_path(find_pathname, find_drive.get_ptr(), find_path.get_ptr());
        dynamic_string find_filename;
        find_filename = find_fname + find_ext;

        find_files file_finder;
        bool success = file_finder.find(find_pathname.get_ptr(), find_filename.get_ptr(), find_files::cFlagAllowFiles | (deep_flag ? find_files::cFlagRecursive : 0));
        if (!success)
        {
            console::error("Failed finding files: %s", find_name.get_ptr());
            return false;
        }

        if (file_finder.get_files().empty())
        {
            console::warning("No files found: %s", find_name.get_ptr());
            return true;
        }

        files.append(file_finder.get_files());

        return true;
    }